

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O0

bool __thiscall
glslang::TLiveTraverser::visitSelection(TLiveTraverser *this,TVisit param_1,TIntermSelection *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermConstantUnion *this_00;
  TConstUnionArray *pTVar3;
  TConstUnion *pTVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermConstantUnion *constant;
  TIntermSelection *node_local;
  TVisit param_1_local;
  TLiveTraverser *this_local;
  
  if ((this->traverseAll & 1U) == 0) {
    iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    this_00 = (TIntermConstantUnion *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x28))();
    if (this_00 == (TIntermConstantUnion *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = TIntermConstantUnion::getConstArray(this_00);
      pTVar4 = TConstUnionArray::operator[](pTVar3,0);
      bVar1 = TConstUnion::getBConst(pTVar4);
      if (bVar1) {
        iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        if (CONCAT44(extraout_var_00,iVar2) != 0) {
          iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))
                    ((long *)CONCAT44(extraout_var_01,iVar2),this);
        }
      }
      pTVar3 = TIntermConstantUnion::getConstArray(this_00);
      pTVar4 = TConstUnionArray::operator[](pTVar3,0);
      bVar1 = TConstUnion::getBConst(pTVar4);
      if (!bVar1) {
        iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
        if (CONCAT44(extraout_var_02,iVar2) != 0) {
          iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x10))
                    ((long *)CONCAT44(extraout_var_03,iVar2),this);
        }
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool visitSelection(TVisit /* visit */,  TIntermSelection* node)
    {
        if (traverseAll)
            return true; // traverse all code

        TIntermConstantUnion* constant = node->getCondition()->getAsConstantUnion();
        if (constant) {
            // cull the path that is dead
            if (constant->getConstArray()[0].getBConst() == true && node->getTrueBlock())
                node->getTrueBlock()->traverse(this);
            if (constant->getConstArray()[0].getBConst() == false && node->getFalseBlock())
                node->getFalseBlock()->traverse(this);

            return false; // don't traverse any more, we did it all above
        } else
            return true; // traverse the whole subtree
    }